

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

schedule_t worker_runnable(__cilkrts_worker *w)

{
  uint uVar1;
  long in_RDI;
  global_state_t *g;
  schedule_t local_4;
  
  if (*(long *)(*(long *)(in_RDI + 0x38) + 0x38) == 0) {
    if (*(int *)(*(long *)(in_RDI + 0x30) + 0x44) == 0) {
      if (*(int *)(in_RDI + 0x28) == 0) {
        if (*(uint *)(*(long *)(in_RDI + 0x30) + 0x4dc) <
            *(uint *)(*(long *)(in_RDI + 0x38) + 0x1a0)) {
          uVar1 = signal_node_should_wait((signal_node_t *)0x116998);
          if (uVar1 != 0) {
            return SCHEDULE_WAIT;
          }
          *(undefined4 *)(*(long *)(in_RDI + 0x38) + 0x1a0) = 0;
        }
      }
      else if ((*(int *)(*(long *)(in_RDI + 0x38) + 0x88) == 1) &&
              (uVar1 = signal_node_should_wait((signal_node_t *)0x1169e9), uVar1 != 0)) {
        return SCHEDULE_WAIT;
      }
      local_4 = SCHEDULE_RUN;
    }
    else {
      local_4 = SCHEDULE_EXIT;
    }
  }
  else {
    local_4 = SCHEDULE_RUN;
  }
  return local_4;
}

Assistant:

schedule_t worker_runnable(__cilkrts_worker *w)
{
    global_state_t *g = w->g;

    /* If this worker has something to do, do it.
       Otherwise the work would be lost. */
    if (w->l->next_frame_ff)
        return SCHEDULE_RUN;

    // If Cilk has explicitly (by the user) been told to exit (i.e., by
    // __cilkrts_end_cilk() -> __cilkrts_stop_workers(g)), then return 0.
    if (g->work_done)
        return SCHEDULE_EXIT;

    if (0 == w->self) {
        // This worker is the root node and is the only one that may query the
        // global state to see if there are still any user workers in Cilk.
        if (w->l->steal_failure_count > g->max_steal_failures) {
            if (signal_node_should_wait(w->l->signal_node)) {
                return SCHEDULE_WAIT;
            } else {
                // Reset the steal_failure_count since we have verified that
                // user workers are still in Cilk.
                w->l->steal_failure_count = 0;
            }
        }
    } else if (WORKER_SYSTEM == w->l->type &&
               signal_node_should_wait(w->l->signal_node)) {
        // This worker has been notified by its parent that it should stop
        // trying to steal.
        return SCHEDULE_WAIT;
    }

    return SCHEDULE_RUN;
}